

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_encoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeEncoder::EncodeValues
          (SequentialAttributeEncoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,EncoderBuffer *out_buffer)

{
  AttributeValueIndex AVar1;
  int64_t iVar2;
  void *out_data;
  void *pvVar3;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RSI;
  GeometryAttribute *in_RDI;
  AttributeValueIndex entry_id;
  uint32_t i;
  uint8_t *value_data;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> value_data_ptr;
  int entry_size;
  PointAttribute *in_stack_ffffffffffffff88;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff90;
  AttributeValueIndex in_stack_ffffffffffffffb4;
  EncoderBuffer *in_stack_ffffffffffffffb8;
  uint local_34;
  
  iVar2 = GeometryAttribute::byte_stride
                    ((GeometryAttribute *)(in_RDI->buffer_descriptor_).buffer_update_count);
  operator_new__((long)(int)iVar2);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            (in_stack_ffffffffffffff90,(uchar *)in_stack_ffffffffffffff88);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
            (in_stack_ffffffffffffff90);
  local_34 = 0;
  while( true ) {
    out_data = (void *)(ulong)local_34;
    pvVar3 = (void *)std::
                     vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                     ::size(in_RSI);
    if (pvVar3 <= out_data) break;
    in_stack_ffffffffffffff90 =
         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
         (in_RDI->buffer_descriptor_).buffer_update_count;
    std::
    vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
    ::operator[](in_RSI,(ulong)local_34);
    AVar1 = PointAttribute::mapped_index(in_stack_ffffffffffffff88,(uint)in_stack_ffffffffffffff90);
    GeometryAttribute::GetValue(in_RDI,in_stack_ffffffffffffffb4,out_data);
    EncoderBuffer::Encode
              (in_stack_ffffffffffffffb8,
               (void *)CONCAT44(in_stack_ffffffffffffffb4.value_,AVar1.value_),(size_t)in_RDI);
    local_34 = local_34 + 1;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (in_stack_ffffffffffffff90);
  return true;
}

Assistant:

bool SequentialAttributeEncoder::EncodeValues(
    const std::vector<PointIndex> &point_ids, EncoderBuffer *out_buffer) {
  const int entry_size = static_cast<int>(attribute_->byte_stride());
  const std::unique_ptr<uint8_t[]> value_data_ptr(new uint8_t[entry_size]);
  uint8_t *const value_data = value_data_ptr.get();
  // Encode all attribute values in their native raw format.
  for (uint32_t i = 0; i < point_ids.size(); ++i) {
    const AttributeValueIndex entry_id = attribute_->mapped_index(point_ids[i]);
    attribute_->GetValue(entry_id, value_data);
    out_buffer->Encode(value_data, entry_size);
  }
  return true;
}